

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::matrixMetric(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int type)

{
  type_conflict5 tVar1;
  int iVar2;
  int iVar3;
  int in_EDX;
  self_type *in_RSI;
  cpp_dec_float<100U,_int,_void> *in_RDI;
  int i_2;
  int i_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absdiag;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxdiag;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mindiag;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  int in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffaac;
  int in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  cpp_dec_float<100U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffad0;
  undefined1 local_524 [80];
  int local_4d4;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined1 local_4bc [28];
  double in_stack_fffffffffffffb60;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffb68;
  int local_46c;
  undefined8 local_468;
  undefined1 local_45c [80];
  undefined1 local_40c [80];
  undefined1 local_3bc [80];
  int local_36c;
  undefined1 local_368 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_318;
  undefined1 local_2c8 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_278;
  undefined8 local_228;
  undefined8 local_220;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_214;
  int local_1c4;
  undefined8 local_1b0;
  undefined8 *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  undefined8 local_198;
  undefined8 *local_190;
  const_reference local_180;
  undefined1 *local_178;
  const_reference local_170;
  undefined1 *local_168;
  const_reference local_160;
  undefined1 *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  undefined1 *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  undefined8 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined8 *local_a0;
  undefined8 *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined8 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  const_reference local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  const_reference local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_220 = 0;
  local_1a0 = &local_214;
  local_1a8 = &local_220;
  local_1b0 = 0;
  this_00 = in_RDI;
  local_1c4 = in_EDX;
  local_f8 = local_1a8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_RDI,(double)in_RDI,
             (type *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
  iVar2 = (**(code **)(*(long *)(in_RSI->m_backend).data._M_elems + 0x20))();
  if (iVar2 == 0) {
    local_228 = 0x3ff0000000000000;
    local_190 = &local_228;
    local_198 = 0;
    local_100 = local_190;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (this_00,(double)in_RDI,
               (type *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
  }
  else {
    if (local_1c4 == 0) {
      local_180 = std::
                  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)(in_RSI[7].m_backend.data._M_elems + 10),0);
      local_178 = local_2c8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)CONCAT44(local_1c4,in_stack_fffffffffffffab0),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      local_170 = std::
                  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)(in_RSI[7].m_backend.data._M_elems + 10),0);
      local_168 = local_368;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)CONCAT44(local_1c4,in_stack_fffffffffffffab0),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      local_36c = 1;
      iVar2 = local_1c4;
      while (in_stack_fffffffffffffab0 = local_36c,
            iVar3 = (**(code **)(*(long *)(in_RSI->m_backend).data._M_elems + 0x20))(),
            in_stack_fffffffffffffab0 < iVar3) {
        local_160 = std::
                    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)(in_RSI[7].m_backend.data._M_elems + 10),(long)local_36c);
        local_158 = local_40c;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffab0),
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        tVar1 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x52fb04);
        if (tVar1) {
          local_108 = &local_278;
          local_110 = local_3bc;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    ((cpp_dec_float<100U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffab0),
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        }
        else {
          tVar1 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x52fb56);
          if (tVar1) {
            local_118 = &local_318;
            local_120 = local_3bc;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      ((cpp_dec_float<100U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffab0),
                       (cpp_dec_float<100U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
          }
        }
        local_36c = local_36c + 1;
      }
      local_d8 = local_45c;
      local_e0 = &local_318;
      local_e8 = &local_278;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_e9,local_e0,local_e8);
      local_d0 = local_45c;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffab0));
      local_b8 = local_45c;
      local_c0 = local_e0;
      local_c8 = local_e8;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffab0),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                 (cpp_dec_float<100U,_int,_void> *)0x52fc62);
      local_128 = &local_214;
      local_130 = local_45c;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffab0),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      local_1c4 = iVar2;
    }
    else if (local_1c4 == 1) {
      local_468 = 0;
      local_90 = &local_214;
      local_98 = &local_468;
      local_88 = local_98;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      local_46c = 0;
      iVar2 = local_1c4;
      while (in_stack_fffffffffffffaac = local_46c,
            iVar3 = (**(code **)(*(long *)(in_RSI->m_backend).data._M_elems + 0x20))(),
            local_1c4 = iVar2, in_stack_fffffffffffffaac < iVar3) {
        local_4c8 = 0x3ff0000000000000;
        local_38 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RSI[7].m_backend.data._M_elems + 10),(long)local_46c);
        local_28 = local_4bc;
        local_30 = &local_4c8;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_38);
        local_20 = local_4bc;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffab0));
        local_10 = local_4bc;
        local_8 = local_30;
        local_18 = local_38;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  ((cpp_dec_float<100U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffab0),
                   (double *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                   (cpp_dec_float<100U,_int,_void> *)0x52fdf5);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator+=(in_stack_fffffffffffffad0,in_RSI);
        local_46c = local_46c + 1;
      }
    }
    else if (local_1c4 == 2) {
      local_4d0 = 0x3ff0000000000000;
      local_a8 = &local_214;
      local_b0 = &local_4d0;
      local_a0 = local_b0;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      local_4d4 = 0;
      iVar2 = local_1c4;
      while (in_stack_fffffffffffffaa8 = local_4d4,
            iVar3 = (**(code **)(*(long *)(in_RSI->m_backend).data._M_elems + 0x20))(),
            in_stack_fffffffffffffaa8 < iVar3) {
        std::
        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)(in_RSI[7].m_backend.data._M_elems + 10),(long)local_4d4);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator*=(in_stack_fffffffffffffad0,in_RSI);
        local_4d4 = local_4d4 + 1;
      }
      local_68 = local_524;
      local_70 = &stack0xfffffffffffffad0;
      local_78 = &local_214;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_79,local_78);
      local_60 = local_524;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffab0));
      local_50 = local_524;
      local_48 = local_70;
      local_58 = local_78;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffab0),
                 (double *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                 (cpp_dec_float<100U,_int,_void> *)0x52ff99);
      local_138 = &local_214;
      local_140 = local_524;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffab0),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      local_1c4 = iVar2;
    }
    local_150 = &local_214;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)CONCAT44(local_1c4,in_stack_fffffffffffffab0),
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)this_00;
}

Assistant:

R SLUFactor<R>::matrixMetric(int type) const
{
   R result = 0.0;

   // catch corner case of empty matrix
   if(dim() == 0)
      return 1.0;

   switch(type)
   {
   // compute condition estimate by ratio of max/min of elements on the diagonal
   case 0:
   {
      R mindiag = spxAbs(this->diag[0]);
      R maxdiag = spxAbs(this->diag[0]);

      for(int i = 1; i < dim(); ++i)
      {
         R absdiag = spxAbs(this->diag[i]);

         if(absdiag < mindiag)
            mindiag = absdiag;
         else if(absdiag > maxdiag)
            maxdiag = absdiag;
      }

      result = maxdiag / mindiag;
      break;
   }

   // compute sum of inverses of all elements on the diagonal
   case 1:
      result = 0.0;

      for(int i = 0; i < dim(); ++i)
         result += 1.0 / this->diag[i];

      break;

   // compute determinant (product of all diagonal elements of U)
   case 2:
      result = 1.0;

      for(int i = 0; i < dim(); ++i)
         result *= this->diag[i];

      result = 1.0 / result;
      break;
   }

   return result;
}